

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

MallocBlock * MallocBlock::Allocate(size_t size,int type)

{
  ThreadCache *heap;
  byte bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  ThreadCache *this;
  sbyte sVar6;
  FreeList *pFVar7;
  size_t sVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  char cVar10;
  size_t __len;
  ulong uVar11;
  MallocBlock *this_00;
  long *in_FS_OFFSET;
  ThreadCachePtr TVar12;
  SafeStrError local_68;
  int local_3c;
  uint local_38;
  char local_31;
  
  cVar10 = FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence;
  sVar8 = CONCAT44(in_register_00000034,type);
  if (Allocate::max_size_t - 0x30 < size) {
    RAW_LOG(-3,"Massive size passed to malloc: %zu",size);
    return (MallocBlock *)0x0;
  }
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence ==
      '\x01') {
    local_31 = FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence
    ;
    local_38 = (uint)FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::
                     FLAGS_malloc_page_fence_readable;
    uVar11 = size + 0x2f & 0xfffffffffffffff0;
    local_3c = type;
    iVar2 = getpagesize();
    __len = (size_t)iVar2;
    iVar3 = (int)(((uVar11 + __len) - 1) / __len);
    pvVar4 = mmap((void *)0x0,(long)(iVar2 * (iVar3 + 1)),3,0x22,-1,0);
    if (pvVar4 == (void *)0xffffffffffffffff) {
      piVar5 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError(&local_68,*piVar5);
      RAW_LOG(-4,"Out of memory: possibly due to page fence overhead: %s",local_68.result_);
    }
    pvVar4 = (void *)((long)pvVar4 + (long)(iVar3 * iVar2));
    iVar2 = mprotect(pvVar4,__len,local_38);
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError(&local_68,*piVar5);
      RAW_LOG(-4,"Guard page setup failed: %s",local_68.result_);
    }
    this_00 = (MallocBlock *)((long)pvVar4 - uVar11);
    type = local_3c;
    cVar10 = local_31;
  }
  else {
    heap = (ThreadCache *)(size + 0x30);
    this = (ThreadCache *)*in_FS_OFFSET;
    if (this == (ThreadCache *)0x0) {
      TVar12 = tcmalloc::ThreadCachePtr::GetSlow();
      this = TVar12.ptr_;
    }
    if (heap < (ThreadCache *)0x401) {
      sVar6 = 3;
      iVar2 = 7;
    }
    else {
      if ((ThreadCache *)0x40000 < heap) {
        this_00 = (MallocBlock *)anon_unknown.dwarf_5043::do_malloc_pages(heap,sVar8);
        goto LAB_001167e8;
      }
      sVar6 = 7;
      iVar2 = 0x3c7f;
    }
    bVar1 = (&tcmalloc::Static::sizemap_)[(uint)((int)heap + iVar2) >> sVar6];
    iVar2 = this->list_[bVar1].size_;
    this_00 = (MallocBlock *)this->list_[bVar1].list_;
    if (this_00 != (MallocBlock *)0x0) {
      pFVar7 = this->list_ + bVar1;
      pFVar7->list_ = (void *)this_00->size1_;
      uVar9 = pFVar7->length_ - 1;
      pFVar7->length_ = uVar9;
      if (uVar9 < pFVar7->lowater_) {
        pFVar7->lowater_ = uVar9;
      }
      this->size_ = this->size_ - iVar2;
      goto LAB_001167ed;
    }
    this_00 = (MallocBlock *)
              tcmalloc::ThreadCache::FetchFromCentralCache
                        (this,(uint)bVar1,iVar2,anon_unknown.dwarf_5043::nop_oom_handler);
  }
LAB_001167e8:
  if (this_00 == (MallocBlock *)0x0) {
    return (MallocBlock *)0x0;
  }
LAB_001167ed:
  sVar8 = 0xdeadbeef;
  if (cVar10 != '\0') {
    sVar8 = 0xabcdefab;
  }
  this_00->magic1_ = sVar8;
  Initialize(this_00,size,type);
  return this_00;
}

Assistant:

static MallocBlock* Allocate(size_t size, int type) {
    // Prevent an integer overflow / crash with large allocation sizes.
    // TODO - Note that for a e.g. 64-bit size_t, max_size_t may not actually
    // be the maximum value, depending on how the compiler treats ~0. The worst
    // practical effect is that allocations are limited to 4Gb or so, even if
    // the address space could take more.
    static size_t max_size_t = ~0;
    if (size > max_size_t - sizeof(MallocBlock)) {
      RAW_LOG(ERROR, "Massive size passed to malloc: %zu", size);
      return nullptr;
    }
    MallocBlock* b = nullptr;
    const bool use_malloc_page_fence = FLAGS_malloc_page_fence;
    const bool malloc_page_fence_readable = FLAGS_malloc_page_fence_readable;
#ifdef HAVE_MMAP
    if (use_malloc_page_fence) {
      // Put the block towards the end of the page and make the next page
      // inaccessible. This will catch buffer overrun right when it happens.
      size_t sz = real_mmapped_size(size);
      int pagesize = getpagesize();
      int num_pages = (sz + pagesize - 1) / pagesize + 1;
      char* p = (char*) mmap(nullptr, num_pages * pagesize, PROT_READ|PROT_WRITE,
                             MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
      if (p == MAP_FAILED) {
        // If the allocation fails, abort rather than returning nullptr to
        // malloc. This is because in most cases, the program will run out
        // of memory in this mode due to tremendous amount of wastage. There
        // is no point in propagating the error elsewhere.
        RAW_LOG(FATAL, "Out of memory: possibly due to page fence overhead: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      // Mark the page after the block inaccessible
      if (mprotect(p + (num_pages - 1) * pagesize, pagesize,
                   PROT_NONE|(malloc_page_fence_readable ? PROT_READ : 0))) {
        RAW_LOG(FATAL, "Guard page setup failed: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      b = (MallocBlock*) (p + (num_pages - 1) * pagesize - sz);
    } else {
      b = (MallocBlock*) do_malloc(real_malloced_size(size));
    }
#else
    b = (MallocBlock*) do_malloc(real_malloced_size(size));
#endif

    // It would be nice to output a diagnostic on allocation failure
    // here, but logging (other than FATAL) requires allocating
    // memory, which could trigger a nasty recursion. Instead, preserve
    // malloc semantics and return nullptr on failure.
    if (b != nullptr) {
      b->magic1_ = use_malloc_page_fence ? kMagicMMap : kMagicMalloc;
      b->Initialize(size, type);
    }
    return b;
  }